

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall pugi::xml_node::append_copy(xml_node *this,xml_attribute *proto)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct *da;
  uint uVar5;
  xml_memory_page *local_20;
  
  uVar5 = 0;
  if (proto->_attr != (xml_attribute_struct *)0x0) {
    pxVar2 = this->_root;
    if (pxVar2 != (xml_node_struct *)0x0) {
      uVar5 = (uint)pxVar2->header & 0xf;
    }
    if ((uVar5 == 7) || (uVar5 == 2)) {
      this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
      uVar1 = this_00->_busy_size + 0x28;
      if (uVar1 < 0x7fd9) {
        local_20 = this_00->_root;
        da = (xml_attribute_struct *)((long)&local_20[1].allocator + this_00->_busy_size);
        this_00->_busy_size = uVar1;
      }
      else {
        da = (xml_attribute_struct *)
             impl::anon_unknown_0::xml_allocator::allocate_memory_oob(this_00,0x28,&local_20);
      }
      if (da == (xml_attribute_struct *)0x0) {
        da = (xml_attribute_struct *)0x0;
      }
      else {
        da->prev_attribute_c = (xml_attribute_struct *)0x0;
        da->next_attribute = (xml_attribute_struct *)0x0;
        da->name = (char_t *)0x0;
        da->value = (char_t *)0x0;
        da->header = ((long)da - (long)local_20) * 0x100;
      }
      if (da != (xml_attribute_struct *)0x0) {
        pxVar3 = this->_root->first_attribute;
        if (pxVar3 == (xml_attribute_struct *)0x0) {
          this->_root->first_attribute = da;
          pxVar3 = da;
        }
        else {
          pxVar4 = pxVar3->prev_attribute_c;
          pxVar4->next_attribute = da;
          da->prev_attribute_c = pxVar4;
        }
        pxVar3->prev_attribute_c = da;
        impl::anon_unknown_0::node_copy_attribute(da,proto->_attr);
        return (xml_attribute)da;
      }
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI_IMPL_FN xml_attribute xml_node::append_copy(const xml_attribute& proto)
	{
		if (!proto) return xml_attribute();
		if (!impl::allow_insert_attribute(type())) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::append_attribute(a._attr, _root);
		impl::node_copy_attribute(a._attr, proto._attr);

		return a;
	}